

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ApiColumnSize(Fts5Context *pCtx,int iCol,int *pnToken)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  int local_6c;
  int i_2;
  void *p;
  char *pcStack_58;
  int n;
  char *z;
  int i_1;
  int i;
  i64 iRowid;
  Fts5Config *pFStack_38;
  int rc;
  Fts5Config *pConfig;
  Fts5FullTable *pTab;
  Fts5Cursor *pCsr;
  int *pnToken_local;
  Fts5Context *pFStack_10;
  int iCol_local;
  Fts5Context *pCtx_local;
  
  pConfig = *(Fts5Config **)pCtx;
  pFStack_38 = *(Fts5Config **)&pConfig->nCol;
  iRowid._4_4_ = 0;
  pTab = (Fts5FullTable *)pCtx;
  pCsr = (Fts5Cursor *)pnToken;
  pnToken_local._4_4_ = iCol;
  if ((*(uint *)(pCtx + 0x50) & 4) != 0) {
    pFStack_10 = pCtx;
    if (pFStack_38->bColumnsize == 0) {
      if (pFStack_38->zContent == (char *)0x0) {
        for (z._4_4_ = 0; z._4_4_ < pFStack_38->nCol; z._4_4_ = z._4_4_ + 1) {
          if (pFStack_38->abUnindexed[z._4_4_] == '\0') {
            *(undefined4 *)(*(long *)(pCtx + 0x10) + (long)z._4_4_ * 4) = 0xffffffff;
          }
        }
      }
      else {
        z._0_4_ = 0;
        while( true ) {
          bVar3 = false;
          if (iRowid._4_4_ == 0) {
            bVar3 = (int)z < pFStack_38->nCol;
          }
          if (!bVar3) break;
          if (pFStack_38->abUnindexed[(int)z] == '\0') {
            pcVar2 = (pTab->p).base.zErrMsg;
            lVar4 = (long)(int)z;
            pcVar1 = (pTab->p).base.zErrMsg + (long)(int)z * 4;
            pcVar1[0] = '\0';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            iRowid._4_4_ = fts5ApiColumnText(pFStack_10,(int)z,&stack0xffffffffffffffa8,
                                             (int *)((long)&p + 4));
            if (iRowid._4_4_ == 0) {
              iRowid._4_4_ = sqlite3Fts5Tokenize(pFStack_38,8,pcStack_58,p._4_4_,pcVar2 + lVar4 * 4,
                                                 fts5ColumnSizeCb);
            }
          }
          z._0_4_ = (int)z + 1;
        }
      }
    }
    else {
      _i_1 = fts5CursorRowid((Fts5Cursor *)pCtx);
      iRowid._4_4_ = sqlite3Fts5StorageDocsize
                               ((Fts5Storage *)pConfig->abUnindexed,_i_1,
                                (int *)(pTab->p).base.zErrMsg);
    }
    *(uint *)&pTab[1].p.base.zErrMsg = *(uint *)&pTab[1].p.base.zErrMsg & 0xfffffffb;
  }
  if (pnToken_local._4_4_ < 0) {
    *(undefined4 *)&(pCsr->base).pVtab = 0;
    for (local_6c = 0; local_6c < pFStack_38->nCol; local_6c = local_6c + 1) {
      *(int *)&(pCsr->base).pVtab =
           *(int *)((pTab->p).base.zErrMsg + (long)local_6c * 4) + *(int *)&(pCsr->base).pVtab;
    }
  }
  else if (pnToken_local._4_4_ < pFStack_38->nCol) {
    *(undefined4 *)&(pCsr->base).pVtab =
         *(undefined4 *)((pTab->p).base.zErrMsg + (long)pnToken_local._4_4_ * 4);
  }
  else {
    *(undefined4 *)&(pCsr->base).pVtab = 0;
    iRowid._4_4_ = 0x19;
  }
  return iRowid._4_4_;
}

Assistant:

static int fts5ApiColumnSize(Fts5Context *pCtx, int iCol, int *pnToken){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
  Fts5Config *pConfig = pTab->p.pConfig;
  int rc = SQLITE_OK;

  if( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_DOCSIZE) ){
    if( pConfig->bColumnsize ){
      i64 iRowid = fts5CursorRowid(pCsr);
      rc = sqlite3Fts5StorageDocsize(pTab->pStorage, iRowid, pCsr->aColumnSize);
    }else if( pConfig->zContent==0 ){
      int i;
      for(i=0; i<pConfig->nCol; i++){
        if( pConfig->abUnindexed[i]==0 ){
          pCsr->aColumnSize[i] = -1;
        }
      }
    }else{
      int i;
      for(i=0; rc==SQLITE_OK && i<pConfig->nCol; i++){
        if( pConfig->abUnindexed[i]==0 ){
          const char *z; int n;
          void *p = (void*)(&pCsr->aColumnSize[i]);
          pCsr->aColumnSize[i] = 0;
          rc = fts5ApiColumnText(pCtx, i, &z, &n);
          if( rc==SQLITE_OK ){
            rc = sqlite3Fts5Tokenize(
                pConfig, FTS5_TOKENIZE_AUX, z, n, p, fts5ColumnSizeCb
            );
          }
        }
      }
    }
    CsrFlagClear(pCsr, FTS5CSR_REQUIRE_DOCSIZE);
  }
  if( iCol<0 ){
    int i;
    *pnToken = 0;
    for(i=0; i<pConfig->nCol; i++){
      *pnToken += pCsr->aColumnSize[i];
    }
  }else if( iCol<pConfig->nCol ){
    *pnToken = pCsr->aColumnSize[iCol];
  }else{
    *pnToken = 0;
    rc = SQLITE_RANGE;
  }
  return rc;
}